

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O2

void __thiscall
CCommandProcessorFragment_OpenGL::Cmd_Init
          (CCommandProcessorFragment_OpenGL *this,CInitCommand *pCommand)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  
  glEnable(0xbe2);
  glDisable(0xb44);
  glDisable(0xb71);
  glMatrixMode(0x1700);
  glLoadIdentity();
  glAlphaFunc(0,0x204);
  glEnable(0xbc0);
  glDepthMask(0);
  piVar1 = pCommand->m_pTextureMemoryUsage;
  this->m_pTextureMemoryUsage = piVar1;
  *piVar1 = 0;
  glGetIntegerv(0xd33,&this->m_MaxTexSize);
  glGetIntegerv(0x8073,&this->m_Max3DTexSize);
  dbg_msg("render","opengl max texture sizes: %d, %d(3D)",(ulong)(uint)this->m_MaxTexSize,
          (ulong)(uint)this->m_Max3DTexSize);
  iVar3 = this->m_Max3DTexSize;
  if (iVar3 < 0x100) {
    dbg_msg("render","*** warning *** max 3D texture size is too low - using the fallback system");
    iVar3 = this->m_Max3DTexSize;
  }
  if (0xff < iVar3) {
    iVar3 = 0x100;
  }
  iVar2 = (int)(0x100 / (long)iVar3);
  this->m_TextureArraySize = iVar2;
  *pCommand->m_pTextureArraySize = iVar2;
  glPixelStorei(0xcf5,1,0x100 % (long)iVar3 & 0xffffffff);
  return;
}

Assistant:

void CCommandProcessorFragment_OpenGL::Cmd_Init(const CInitCommand *pCommand)
{
	// set some default settings
	glEnable(GL_BLEND);
	glDisable(GL_CULL_FACE);
	glDisable(GL_DEPTH_TEST);
	glMatrixMode(GL_MODELVIEW);
	glLoadIdentity();

	glAlphaFunc(GL_GREATER, 0);
	glEnable(GL_ALPHA_TEST);
	glDepthMask(0);

	m_pTextureMemoryUsage = pCommand->m_pTextureMemoryUsage;
	*m_pTextureMemoryUsage = 0;
	glGetIntegerv(GL_MAX_TEXTURE_SIZE, &m_MaxTexSize);
	glGetIntegerv(GL_MAX_3D_TEXTURE_SIZE, &m_Max3DTexSize);
	dbg_msg("render", "opengl max texture sizes: %d, %d(3D)", m_MaxTexSize, m_Max3DTexSize);
	if(m_Max3DTexSize < IGraphics::NUMTILES_DIMENSION * IGraphics::NUMTILES_DIMENSION)
		dbg_msg("render", "*** warning *** max 3D texture size is too low - using the fallback system");
	m_TextureArraySize = IGraphics::NUMTILES_DIMENSION * IGraphics::NUMTILES_DIMENSION / minimum(m_Max3DTexSize, IGraphics::NUMTILES_DIMENSION * IGraphics::NUMTILES_DIMENSION);
	*pCommand->m_pTextureArraySize = m_TextureArraySize;

	glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
}